

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O1

void Io_WriteVerilogInt(FILE *pFile,Abc_Ntk_t *pNtk,int fOnlyAnds)

{
  long *plVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  Mio_Gate_t *pGate;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  Vec_Vec_t *vLevels;
  void **ppvVar11;
  Hop_Obj_t *pHVar12;
  Hop_Obj_t *pHVar13;
  Mio_Pin_t *pPin;
  ulong uVar14;
  Vec_Ptr_t *pVVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int local_74;
  
  pcVar8 = Io_WriteVerilogGetName(pNtk->pName);
  fprintf((FILE *)pFile,"module %s ( ",pcVar8);
  if ((0 < pNtk->nObjCounts[8]) &&
     (iVar6 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar6 == -1)) {
    fwrite("clock, ",7,1,(FILE *)pFile);
  }
  fwrite("\n   ",4,1,(FILE *)pFile);
  if (0 < pNtk->vPis->nSize) {
    Io_WriteVerilogPis(pFile,pNtk,3);
    fwrite(",\n   ",5,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPos->nSize) {
    Io_WriteVerilogPos(pFile,pNtk,3);
  }
  fwrite("  );\n",5,1,(FILE *)pFile);
  if ((0 < pNtk->nObjCounts[8]) &&
     (iVar6 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar6 == -1)) {
    fwrite("  input  clock;\n",0x10,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPis->nSize) {
    fwrite("  input ",8,1,(FILE *)pFile);
    Io_WriteVerilogPis(pFile,pNtk,10);
    fwrite(";\n",2,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPos->nSize) {
    fwrite("  output",8,1,(FILE *)pFile);
    Io_WriteVerilogPos(pFile,pNtk,5);
    fwrite(";\n",2,1,(FILE *)pFile);
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLACKBOX) {
    if (0 < pNtk->nObjCounts[8]) {
      fwrite("  reg",5,1,(FILE *)pFile);
      pVVar15 = pNtk->vBoxes;
      if (0 < pVVar15->nSize) {
        iVar6 = pNtk->nObjCounts[8];
        iVar22 = 4;
        lVar18 = 0;
        iVar25 = 0;
        iVar24 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pAVar2 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
            pcVar8 = Abc_ObjName(pAVar2);
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            sVar9 = strlen(pcVar8);
            iVar23 = (int)sVar9 + 2;
            if (iVar24 == 0) {
LAB_00348c5f:
              iVar24 = 0;
            }
            else if (0x4b < iVar22 + iVar23) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar22 = 3;
              goto LAB_00348c5f;
            }
            iVar25 = iVar25 + 1;
            pcVar8 = Abc_ObjName(pAVar2);
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            pcVar16 = ",";
            if (iVar25 == iVar6) {
              pcVar16 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar8,pcVar16);
            iVar22 = iVar22 + iVar23;
            iVar24 = iVar24 + 1;
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vBoxes;
        } while (lVar18 < pVVar15->nSize);
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    iVar6 = Io_WriteVerilogWiresCount(pNtk);
    if (0 < iVar6) {
      fwrite("  wire",6,1,(FILE *)pFile);
      iVar6 = Io_WriteVerilogWiresCount(pNtk);
      pVVar15 = pNtk->vObjs;
      if (pVVar15->nSize < 1) {
        iVar22 = 0;
        iVar24 = 4;
        local_74 = 0;
      }
      else {
        iVar24 = 4;
        lVar18 = 0;
        local_74 = 0;
        iVar22 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((((plVar1 != (long *)0x0) && (lVar18 != 0)) &&
              ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
             ((pAVar2 = *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8),
              (pAVar2->vFanouts).nSize < 1 ||
              ((*(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x14) &
               0xf) - 5 < 0xfffffffe)))) {
            pcVar8 = Abc_ObjName(pAVar2);
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            sVar9 = strlen(pcVar8);
            iVar25 = (int)sVar9 + 2;
            if (iVar22 == 0) {
LAB_00348e01:
              iVar22 = 0;
            }
            else if (0x4b < iVar25 + iVar24) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar24 = 3;
              goto LAB_00348e01;
            }
            local_74 = local_74 + 1;
            pcVar8 = Abc_ObjName(pAVar2);
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            pcVar16 = ",";
            if (local_74 == iVar6) {
              pcVar16 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar8,pcVar16);
            iVar24 = iVar24 + iVar25;
            iVar22 = iVar22 + 1;
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vObjs;
        } while (lVar18 < pVVar15->nSize);
      }
      pVVar15 = pNtk->vBoxes;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pAVar2 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
            pcVar8 = Abc_ObjName(pAVar2);
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            sVar9 = strlen(pcVar8);
            iVar25 = (int)sVar9 + 2;
            if (iVar22 == 0) {
LAB_00348f2c:
              iVar22 = 0;
            }
            else if (0x4b < iVar24 + iVar25) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar24 = 3;
              goto LAB_00348f2c;
            }
            local_74 = local_74 + 1;
            pcVar8 = Abc_ObjName(pAVar2);
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            pcVar16 = ",";
            if (local_74 == iVar6) {
              pcVar16 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar8,pcVar16);
            iVar24 = iVar24 + iVar25;
            iVar22 = iVar22 + 1;
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vBoxes;
        } while (lVar18 < pVVar15->nSize);
      }
      pVVar15 = pNtk->vBoxes;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
            if (0 < *(int *)((long)plVar1 + 0x1c)) {
              lVar19 = 0;
              do {
                plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)(plVar1[4] + lVar19 * 4) * 8);
                pAVar2 = *(Abc_Obj_t **)
                          (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
                pcVar8 = Abc_ObjName(pAVar2);
                pcVar8 = Io_WriteVerilogGetName(pcVar8);
                sVar9 = strlen(pcVar8);
                iVar25 = (int)sVar9 + 2;
                if (iVar22 == 0) {
LAB_00349074:
                  iVar22 = 0;
                }
                else if (0x4b < iVar24 + iVar25) {
                  fwrite("\n   ",4,1,(FILE *)pFile);
                  iVar24 = 3;
                  goto LAB_00349074;
                }
                pcVar8 = Abc_ObjName(pAVar2);
                pcVar8 = Io_WriteVerilogGetName(pcVar8);
                pcVar16 = ",";
                if (local_74 + (1 - iVar6) + (int)lVar19 == 0) {
                  pcVar16 = "";
                }
                fprintf((FILE *)pFile," %s%s",pcVar8,pcVar16);
                iVar24 = iVar24 + iVar25;
                iVar22 = iVar22 + 1;
                lVar19 = lVar19 + 1;
              } while (lVar19 < *(int *)((long)plVar1 + 0x1c));
              local_74 = local_74 + (int)lVar19;
            }
            if (0 < *(int *)((long)plVar1 + 0x2c)) {
              lVar19 = 0;
              do {
                plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)(plVar1[6] + lVar19 * 4) * 8);
                pAVar2 = *(Abc_Obj_t **)
                          (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
                if (((pAVar2->vFanouts).nSize < 1) ||
                   ((*(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x14)
                    & 0xf) - 5 < 0xfffffffe)) {
                  pcVar8 = Abc_ObjName(pAVar2);
                  pcVar8 = Io_WriteVerilogGetName(pcVar8);
                  sVar9 = strlen(pcVar8);
                  iVar25 = (int)sVar9 + 2;
                  if (iVar22 == 0) {
LAB_00349191:
                    iVar22 = 0;
                  }
                  else if (0x4b < iVar24 + iVar25) {
                    fwrite("\n   ",4,1,(FILE *)pFile);
                    iVar24 = 3;
                    goto LAB_00349191;
                  }
                  local_74 = local_74 + 1;
                  pcVar8 = Abc_ObjName(pAVar2);
                  pcVar8 = Io_WriteVerilogGetName(pcVar8);
                  pcVar16 = ",";
                  if (local_74 == iVar6) {
                    pcVar16 = "";
                  }
                  fprintf((FILE *)pFile," %s%s",pcVar8,pcVar16);
                  iVar24 = iVar24 + iVar25;
                  iVar22 = iVar22 + 1;
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < *(int *)((long)plVar1 + 0x2c));
            }
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vBoxes;
        } while (lVar18 < pVVar15->nSize);
      }
      if (local_74 != iVar6) {
        __assert_fail("Counter == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteVerilog.c"
                      ,0x17e,"void Io_WriteVerilogWires(FILE *, Abc_Ntk_t *, int)");
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    pVVar15 = pNtk->vBoxes;
    uVar17 = pVVar15->nSize - pNtk->nObjCounts[8];
    if (uVar17 < 2) {
      uVar14 = (ulong)uVar17;
    }
    else {
      uVar14 = 0;
      uVar17 = uVar17 - 1;
      if (uVar17 != 0) {
        do {
          uVar14 = (ulong)((int)uVar14 + 1);
          bVar5 = 9 < uVar17;
          uVar17 = uVar17 / 10;
        } while (bVar5);
      }
    }
    if (0 < pVVar15->nSize) {
      lVar18 = 0;
      uVar17 = 0;
      do {
        plVar1 = (long *)pVVar15->pArray[lVar18];
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
          lVar19 = plVar1[7];
          fprintf((FILE *)pFile,"  %s box%0*d",*(undefined8 *)(lVar19 + 8),uVar14,(ulong)uVar17);
          fputc(0x28,(FILE *)pFile);
          lVar10 = *(long *)(lVar19 + 0x28);
          if (0 < *(int *)(lVar10 + 4)) {
            lVar20 = 0;
            do {
              plVar3 = *(long **)(*(long *)(lVar10 + 8) + lVar20 * 8);
              pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[6] * 8));
              pcVar8 = Io_WriteVerilogGetName(pcVar8);
              fprintf((FILE *)pFile,".%s",pcVar8);
              plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)(plVar1[4] + lVar20 * 4) * 8);
              pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8));
              pcVar8 = Io_WriteVerilogGetName(pcVar8);
              fprintf((FILE *)pFile,"(%s), ",pcVar8);
              lVar20 = lVar20 + 1;
              lVar10 = *(long *)(lVar19 + 0x28);
            } while (lVar20 < *(int *)(lVar10 + 4));
          }
          lVar10 = *(long *)(lVar19 + 0x30);
          if (0 < *(int *)(lVar10 + 4)) {
            uVar21 = 0;
            do {
              plVar3 = *(long **)(*(long *)(lVar10 + 8) + uVar21 * 8);
              pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8));
              pcVar8 = Io_WriteVerilogGetName(pcVar8);
              fprintf((FILE *)pFile,".%s",pcVar8);
              plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)(plVar1[6] + uVar21 * 4) * 8);
              pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[6] * 8));
              pcVar16 = Io_WriteVerilogGetName(pcVar8);
              pcVar8 = "    \"%s\", ";
              if (uVar21 == *(int *)(*(long *)(lVar19 + 0x30) + 4) - 1) {
                pcVar8 = "T = %d\t\t";
              }
              fprintf((FILE *)pFile,"(%s)%s",pcVar16,pcVar8 + 8);
              uVar21 = uVar21 + 1;
              lVar10 = *(long *)(lVar19 + 0x30);
            } while ((long)uVar21 < (long)*(int *)(lVar10 + 4));
          }
          uVar17 = uVar17 + 1;
          fwrite(");\n",3,1,(FILE *)pFile);
        }
        lVar18 = lVar18 + 1;
        pVVar15 = pNtk->vBoxes;
      } while (lVar18 < pVVar15->nSize);
    }
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      iVar6 = Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc);
      uVar17 = pNtk->nObjCounts[7];
      if (1 < uVar17) {
        uVar26 = 0;
        uVar7 = uVar17 - 1;
        uVar17 = uVar26;
        if (uVar7 != 0) {
          do {
            uVar17 = uVar26 + 1;
            bVar5 = 9 < uVar7;
            uVar26 = uVar17;
            uVar7 = uVar7 / 10;
          } while (bVar5);
        }
      }
      pVVar15 = pNtk->vObjs;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        uVar14 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) {
            pGate = (Mio_Gate_t *)plVar1[7];
            if (*(int *)((long)plVar1 + 0x1c) == 0) {
              pcVar8 = Mio_GateReadName(pGate);
              iVar22 = strcmp(pcVar8,"_const0_");
              if (iVar22 != 0) {
                pcVar8 = Mio_GateReadName(pGate);
                iVar22 = strcmp(pcVar8,"_const1_");
                if (iVar22 != 0) goto LAB_00349750;
              }
              pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[6] * 8));
              pcVar8 = Io_WriteVerilogGetName(pcVar8);
              pcVar16 = Mio_GateReadName(pGate);
              iVar22 = strcmp(pcVar16,"_const1_");
              fprintf((FILE *)pFile,"  %-*s %s = 1\'b%d;\n",iVar6,"assign",pcVar8,
                      (ulong)(iVar22 == 0));
            }
            else {
LAB_00349750:
              pcVar8 = Mio_GateReadName(pGate);
              lVar19 = 0;
              fprintf((FILE *)pFile,"  %-*s g%0*d",iVar6,pcVar8,(ulong)uVar17,uVar14);
              fputc(0x28,(FILE *)pFile);
              pPin = Mio_GateReadPins(pGate);
              if (pPin != (Mio_Pin_t *)0x0) {
                lVar19 = 0;
                do {
                  pcVar8 = Mio_PinReadName(pPin);
                  pcVar8 = Io_WriteVerilogGetName(pcVar8);
                  fprintf((FILE *)pFile,".%s",pcVar8);
                  pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                        (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                        (long)*(int *)(plVar1[4] + lVar19 * 4) * 8));
                  pcVar8 = Io_WriteVerilogGetName(pcVar8);
                  fprintf((FILE *)pFile,"(%s), ",pcVar8);
                  pPin = Mio_PinReadNext(pPin);
                  lVar19 = lVar19 + 1;
                } while (pPin != (Mio_Pin_t *)0x0);
              }
              if ((int)lVar19 != *(int *)((long)plVar1 + 0x1c)) {
                __assert_fail("i == Abc_ObjFaninNum(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteVerilog.c"
                              ,0x227,"void Io_WriteVerilogObjects(FILE *, Abc_Ntk_t *, int)");
              }
              uVar14 = (ulong)((int)uVar14 + 1);
              pcVar8 = Mio_GateReadOutName(pGate);
              pcVar8 = Io_WriteVerilogGetName(pcVar8);
              fprintf((FILE *)pFile,".%s",pcVar8);
              pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[6] * 8));
              pcVar8 = Io_WriteVerilogGetName(pcVar8);
              fprintf((FILE *)pFile,"(%s)",pcVar8);
              fwrite(");\n",3,1,(FILE *)pFile);
            }
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vObjs;
        } while (lVar18 < pVVar15->nSize);
      }
    }
    else {
      vLevels = (Vec_Vec_t *)malloc(0x10);
      vLevels->nCap = 10;
      vLevels->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      vLevels->pArray = ppvVar11;
      pVVar15 = pNtk->vObjs;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) {
            pHVar13 = (Hop_Obj_t *)plVar1[7];
            pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[6] * 8));
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            fprintf((FILE *)pFile,"  assign %s = ",pcVar8);
            if (0 < *(int *)((long)plVar1 + 0x1c)) {
              lVar19 = 0;
              do {
                pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                      (long)*(int *)(plVar1[4] + lVar19 * 4) * 8));
                pcVar8 = Io_WriteVerilogGetName(pcVar8);
                pcVar8 = Extra_UtilStrsav(pcVar8);
                pHVar12 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,(int)lVar19);
                (pHVar12->field_0).pData = pcVar8;
                lVar19 = lVar19 + 1;
              } while (lVar19 < *(int *)((long)plVar1 + 0x1c));
            }
            Hop_ObjPrintVerilog(pFile,pHVar13,vLevels,0,fOnlyAnds);
            fwrite(";\n",2,1,(FILE *)pFile);
            if (0 < *(int *)((long)plVar1 + 0x1c)) {
              iVar6 = 0;
              do {
                pHVar13 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar6);
                if ((pHVar13->field_0).pData != (void *)0x0) {
                  pHVar13 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar6);
                  free((pHVar13->field_0).pData);
                  pHVar13 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar6);
                  (pHVar13->field_0).pData = (void *)0x0;
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 < *(int *)((long)plVar1 + 0x1c));
            }
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vObjs;
        } while (lVar18 < pVVar15->nSize);
      }
      if (0 < vLevels->nSize) {
        lVar18 = 0;
        do {
          pvVar4 = vLevels->pArray[lVar18];
          if (pvVar4 != (void *)0x0) {
            if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar4 + 8));
              *(undefined8 *)((long)pvVar4 + 8) = 0;
            }
            free(pvVar4);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < vLevels->nSize);
      }
      if (vLevels->pArray != (void **)0x0) {
        free(vLevels->pArray);
        vLevels->pArray = (void **)0x0;
      }
      free(vLevels);
    }
    if (0 < pNtk->nObjCounts[8]) {
      fwrite("  always @ (posedge clock) begin\n",0x21,1,(FILE *)pFile);
      pVVar15 = pNtk->vBoxes;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        do {
          plVar1 = (long *)pVVar15->pArray[lVar18];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar3 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)plVar3[6] * 8));
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            fprintf((FILE *)pFile,"    %s",pcVar8);
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            pcVar8 = Io_WriteVerilogGetName(pcVar8);
            fprintf((FILE *)pFile," <= %s;\n",pcVar8);
          }
          lVar18 = lVar18 + 1;
          pVVar15 = pNtk->vBoxes;
        } while (lVar18 < pVVar15->nSize);
      }
      fwrite("  end\n",6,1,(FILE *)pFile);
      uVar17 = pNtk->vBoxes->nSize;
      if ((int)uVar17 < 1) {
        uVar14 = 0;
      }
      else {
        uVar21 = 0;
        do {
          pvVar4 = pNtk->vBoxes->pArray[uVar21];
          if (((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 8) &&
             (uVar14 = uVar21, *(int *)((long)pvVar4 + 0x38) - 1U < 2)) break;
          uVar21 = uVar21 + 1;
          uVar14 = (ulong)uVar17;
        } while (uVar17 != uVar21);
      }
      if ((int)uVar14 != pNtk->nObjCounts[8]) {
        fwrite("  initial begin\n",0x10,1,(FILE *)pFile);
        pVVar15 = pNtk->vBoxes;
        if (0 < pVVar15->nSize) {
          lVar18 = 0;
          do {
            plVar1 = (long *)pVVar15->pArray[lVar18];
            if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
              pcVar8 = "    %s <= 1\'b0;\n";
              if ((int)plVar1[7] != 1) {
                if ((int)plVar1[7] != 2) goto LAB_00349bb2;
                pcVar8 = "    %s <= 1\'b1;\n";
              }
              plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)plVar1[6] * 8);
              pcVar16 = Abc_ObjName(*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                     (long)*(int *)plVar1[6] * 8));
              pcVar16 = Io_WriteVerilogGetName(pcVar16);
              fprintf((FILE *)pFile,pcVar8,pcVar16);
            }
LAB_00349bb2:
            lVar18 = lVar18 + 1;
            pVVar15 = pNtk->vBoxes;
          } while (lVar18 < pVVar15->nSize);
        }
        fwrite("  end\n",6,1,(FILE *)pFile);
      }
    }
  }
  fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteVerilogInt( FILE * pFile, Abc_Ntk_t * pNtk, int fOnlyAnds )
{
    // write inputs and outputs
//    fprintf( pFile, "module %s ( gclk,\n   ", Abc_NtkName(pNtk) );
    fprintf( pFile, "module %s ( ", Io_WriteVerilogGetName(Abc_NtkName(pNtk)) );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "clock, " );
    // write other primary inputs
    fprintf( pFile, "\n   " );
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
        Io_WriteVerilogPis( pFile, pNtk, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
        Io_WriteVerilogPos( pFile, pNtk, 3 );
    fprintf( pFile, "  );\n" );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "  input  clock;\n" );
    // write inputs, outputs, registers, and wires
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
//        fprintf( pFile, "  input gclk," );
        fprintf( pFile, "  input " );
        Io_WriteVerilogPis( pFile, pNtk, 10 );
        fprintf( pFile, ";\n" );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
    {
        fprintf( pFile, "  output" );
        Io_WriteVerilogPos( pFile, pNtk, 5 );
        fprintf( pFile, ";\n" );
    }
    // if this is not a blackbox, write internal signals
    if ( !Abc_NtkHasBlackbox(pNtk) )
    {
        if ( Abc_NtkLatchNum(pNtk) > 0 )
        {
            fprintf( pFile, "  reg" );
            Io_WriteVerilogRegs( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        if ( Io_WriteVerilogWiresCount(pNtk) > 0 )
        {
            fprintf( pFile, "  wire" );
            Io_WriteVerilogWires( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        // write nodes
        Io_WriteVerilogObjects( pFile, pNtk, fOnlyAnds );        
        // write registers
        if ( Abc_NtkLatchNum(pNtk) > 0 )
            Io_WriteVerilogLatches( pFile, pNtk );
    }
    // finalize the file
    fprintf( pFile, "endmodule\n\n" );
}